

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dec_sse2.c
# Opt level: O3

void SimpleVFilter16_SSE2(uint8_t *p,int stride,int thresh)

{
  undefined1 auVar1 [16];
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  byte bVar8;
  byte bVar9;
  byte bVar10;
  byte bVar11;
  byte bVar12;
  byte bVar13;
  byte bVar14;
  byte bVar15;
  byte bVar16;
  byte bVar17;
  long lVar18;
  undefined1 auVar19 [16];
  undefined1 uVar22;
  undefined1 uVar23;
  undefined1 uVar24;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  byte bVar25;
  byte bVar35;
  byte bVar36;
  byte bVar37;
  undefined1 auVar26 [16];
  undefined1 auVar34 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar48 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  
  lVar18 = (long)stride;
  auVar19 = *(undefined1 (*) [16])(p + lVar18 * -2);
  auVar34 = *(undefined1 (*) [16])(p + -lVar18);
  auVar1 = *(undefined1 (*) [16])p;
  auVar48 = *(undefined1 (*) [16])(p + lVar18);
  uVar24 = (undefined1)((uint)thresh >> 0x18);
  uVar23 = (undefined1)((uint)thresh >> 0x10);
  uVar22 = (undefined1)((uint)thresh >> 8);
  auVar20._4_4_ =
       (int)(CONCAT35(CONCAT21(CONCAT11(uVar24,uVar24),uVar23),CONCAT14(uVar23,thresh)) >> 0x20);
  auVar20[3] = uVar22;
  auVar20[2] = uVar22;
  auVar20[0] = (undefined1)thresh;
  auVar20[1] = auVar20[0];
  auVar20._8_8_ = 0;
  auVar20 = pshuflw(auVar20,auVar20,0);
  auVar21 = psubusb(auVar48,auVar19);
  auVar38 = psubusb(auVar19,auVar48);
  auVar38 = auVar38 | auVar21;
  auVar39._0_2_ = auVar38._0_2_ >> 1;
  auVar39._2_2_ = auVar38._2_2_ >> 1;
  auVar39._4_2_ = auVar38._4_2_ >> 1;
  auVar39._6_2_ = auVar38._6_2_ >> 1;
  auVar39._8_2_ = auVar38._8_2_ >> 1;
  auVar39._10_2_ = auVar38._10_2_ >> 1;
  auVar39._12_2_ = auVar38._12_2_ >> 1;
  auVar39._14_2_ = auVar38._14_2_ >> 1;
  auVar21 = psubusb(auVar1,auVar34);
  auVar38 = psubusb(auVar34,auVar1);
  auVar21 = paddusb(auVar38 | auVar21,auVar38 | auVar21);
  auVar38 = paddusb(auVar39 & _DAT_001261b0,auVar21);
  auVar19 = psubsb(auVar19 ^ _DAT_001265d0,auVar48 ^ _DAT_001265d0);
  auVar48 = psubsb(auVar1 ^ _DAT_001265d0,auVar34 ^ _DAT_001265d0);
  auVar19 = paddsb(auVar19,auVar48);
  auVar19 = paddsb(auVar19,auVar48);
  auVar19 = paddsb(auVar19,auVar48);
  bVar2 = auVar38[0];
  bVar25 = auVar20[0];
  bVar3 = auVar38[1];
  bVar35 = auVar20[1];
  bVar4 = auVar38[2];
  bVar36 = auVar20[2];
  bVar5 = auVar38[3];
  bVar37 = auVar20[3];
  bVar6 = auVar38[4];
  bVar7 = auVar38[5];
  bVar8 = auVar38[6];
  bVar9 = auVar38[7];
  bVar10 = auVar38[8];
  bVar11 = auVar38[9];
  bVar12 = auVar38[10];
  bVar13 = auVar38[0xb];
  bVar14 = auVar38[0xc];
  bVar15 = auVar38[0xd];
  bVar16 = auVar38[0xe];
  bVar17 = auVar38[0xf];
  auVar21[0] = -((byte)((bVar2 < bVar25) * bVar2 | (bVar2 >= bVar25) * bVar25) == bVar2);
  auVar21[1] = -((byte)((bVar3 < bVar35) * bVar3 | (bVar3 >= bVar35) * bVar35) == bVar3);
  auVar21[2] = -((byte)((bVar4 < bVar36) * bVar4 | (bVar4 >= bVar36) * bVar36) == bVar4);
  auVar21[3] = -((byte)((bVar5 < bVar37) * bVar5 | (bVar5 >= bVar37) * bVar37) == bVar5);
  auVar21[4] = -((byte)((bVar6 < bVar25) * bVar6 | (bVar6 >= bVar25) * bVar25) == bVar6);
  auVar21[5] = -((byte)((bVar7 < bVar35) * bVar7 | (bVar7 >= bVar35) * bVar35) == bVar7);
  auVar21[6] = -((byte)((bVar8 < bVar36) * bVar8 | (bVar8 >= bVar36) * bVar36) == bVar8);
  auVar21[7] = -((byte)((bVar9 < bVar37) * bVar9 | (bVar9 >= bVar37) * bVar37) == bVar9);
  auVar21[8] = -((byte)((bVar10 < bVar25) * bVar10 | (bVar10 >= bVar25) * bVar25) == bVar10);
  auVar21[9] = -((byte)((bVar11 < bVar35) * bVar11 | (bVar11 >= bVar35) * bVar35) == bVar11);
  auVar21[10] = -((byte)((bVar12 < bVar36) * bVar12 | (bVar12 >= bVar36) * bVar36) == bVar12);
  auVar21[0xb] = -((byte)((bVar13 < bVar37) * bVar13 | (bVar13 >= bVar37) * bVar37) == bVar13);
  auVar21[0xc] = -((byte)((bVar14 < bVar25) * bVar14 | (bVar14 >= bVar25) * bVar25) == bVar14);
  auVar21[0xd] = -((byte)((bVar15 < bVar35) * bVar15 | (bVar15 >= bVar35) * bVar35) == bVar15);
  auVar21[0xe] = -((byte)((bVar16 < bVar36) * bVar16 | (bVar16 >= bVar36) * bVar36) == bVar16);
  auVar21[0xf] = -((byte)((bVar17 < bVar37) * bVar17 | (bVar17 >= bVar37) * bVar37) == bVar17);
  auVar48 = paddsb(_DAT_00127550,auVar21 & auVar19);
  auVar19 = paddsb(auVar21 & auVar19,_DAT_00127560);
  auVar47._0_14_ = auVar38._0_14_;
  auVar47[0xe] = bVar9;
  auVar47[0xf] = auVar19[7];
  auVar46._14_2_ = auVar47._14_2_;
  auVar46._0_13_ = auVar38._0_13_;
  auVar46[0xd] = auVar19[6];
  auVar45._13_3_ = auVar46._13_3_;
  auVar45._0_12_ = auVar38._0_12_;
  auVar45[0xc] = bVar8;
  auVar44._12_4_ = auVar45._12_4_;
  auVar44._0_11_ = auVar38._0_11_;
  auVar44[0xb] = auVar19[5];
  auVar43._11_5_ = auVar44._11_5_;
  auVar43._0_10_ = auVar38._0_10_;
  auVar43[10] = bVar7;
  auVar42._10_6_ = auVar43._10_6_;
  auVar42._0_9_ = auVar38._0_9_;
  auVar42[9] = auVar19[4];
  auVar41._9_7_ = auVar42._9_7_;
  auVar41._0_8_ = auVar38._0_8_;
  auVar41[8] = bVar6;
  auVar40._8_8_ = auVar41._8_8_;
  auVar40[7] = auVar19[3];
  auVar40[6] = bVar5;
  auVar40[5] = auVar19[2];
  auVar40[4] = bVar4;
  auVar40[3] = auVar19[1];
  auVar40[2] = bVar3;
  auVar40[1] = auVar19[0];
  auVar40[0] = bVar2;
  auVar38[1] = auVar19[8];
  auVar38[0] = auVar19[8];
  auVar38[2] = auVar19[9];
  auVar38[3] = auVar19[9];
  auVar38[4] = auVar19[10];
  auVar38[5] = auVar19[10];
  auVar38[6] = auVar19[0xb];
  auVar38[7] = auVar19[0xb];
  auVar38[8] = auVar19[0xc];
  auVar38[9] = auVar19[0xc];
  auVar38[10] = auVar19[0xd];
  auVar38[0xb] = auVar19[0xd];
  auVar38[0xc] = auVar19[0xe];
  auVar38[0xd] = auVar19[0xe];
  auVar38[0xf] = auVar19[0xf];
  auVar38[0xe] = auVar38[0xf];
  auVar20 = psraw(auVar40,0xb);
  auVar19 = psraw(auVar38,0xb);
  auVar20 = packsswb(auVar20,auVar19);
  auVar33._0_14_ = auVar19._0_14_;
  auVar33[0xe] = auVar19[7];
  auVar33[0xf] = auVar48[7];
  auVar32._14_2_ = auVar33._14_2_;
  auVar32._0_13_ = auVar19._0_13_;
  auVar32[0xd] = auVar48[6];
  auVar31._13_3_ = auVar32._13_3_;
  auVar31._0_12_ = auVar19._0_12_;
  auVar31[0xc] = auVar19[6];
  auVar30._12_4_ = auVar31._12_4_;
  auVar30._0_11_ = auVar19._0_11_;
  auVar30[0xb] = auVar48[5];
  auVar29._11_5_ = auVar30._11_5_;
  auVar29._0_10_ = auVar19._0_10_;
  auVar29[10] = auVar19[5];
  auVar28._10_6_ = auVar29._10_6_;
  auVar28._0_9_ = auVar19._0_9_;
  auVar28[9] = auVar48[4];
  auVar27._9_7_ = auVar28._9_7_;
  auVar27._0_8_ = auVar19._0_8_;
  auVar27[8] = auVar19[4];
  auVar26._8_8_ = auVar27._8_8_;
  auVar26[7] = auVar48[3];
  auVar26[6] = auVar19[3];
  auVar26[5] = auVar48[2];
  auVar26[4] = auVar19[2];
  auVar26[3] = auVar48[1];
  auVar26[2] = auVar19[1];
  auVar26[0] = auVar19[0];
  auVar26[1] = auVar48[0];
  auVar19[1] = auVar48[8];
  auVar19[0] = auVar48[8];
  auVar19[2] = auVar48[9];
  auVar19[3] = auVar48[9];
  auVar19[4] = auVar48[10];
  auVar19[5] = auVar48[10];
  auVar19[6] = auVar48[0xb];
  auVar19[7] = auVar48[0xb];
  auVar19[8] = auVar48[0xc];
  auVar19[9] = auVar48[0xc];
  auVar19[10] = auVar48[0xd];
  auVar19[0xb] = auVar48[0xd];
  auVar19[0xc] = auVar48[0xe];
  auVar19[0xd] = auVar48[0xe];
  auVar19[0xf] = auVar48[0xf];
  auVar19[0xe] = auVar19[0xf];
  auVar48 = psraw(auVar26,0xb);
  auVar19 = psraw(auVar19,0xb);
  auVar48 = packsswb(auVar48,auVar19);
  auVar19 = psubsb(auVar1 ^ _DAT_001265d0,auVar20);
  auVar34 = paddsb(auVar48,auVar34 ^ _DAT_001265d0);
  auVar19 = auVar19 ^ _DAT_001265d0;
  *(undefined1 (*) [16])(p + -lVar18) = auVar34 ^ _DAT_001265d0;
  *(undefined1 (*) [16])p = auVar19;
  return;
}

Assistant:

static void SimpleVFilter16_SSE2(uint8_t* p, int stride, int thresh) {
  // Load
  __m128i p1 = _mm_loadu_si128((__m128i*)&p[-2 * stride]);
  __m128i p0 = _mm_loadu_si128((__m128i*)&p[-stride]);
  __m128i q0 = _mm_loadu_si128((__m128i*)&p[0]);
  __m128i q1 = _mm_loadu_si128((__m128i*)&p[stride]);

  DoFilter2_SSE2(&p1, &p0, &q0, &q1, thresh);

  // Store
  _mm_storeu_si128((__m128i*)&p[-stride], p0);
  _mm_storeu_si128((__m128i*)&p[0], q0);
}